

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

bool __thiscall Json::Value::removeMember(Value *this,char *key,char *cend,Value *removed)

{
  iterator __position;
  int in_EDX;
  char *in_RSI;
  long in_RDI;
  iterator it;
  CZString actualKey;
  Value *in_stack_ffffffffffffff48;
  Value *this_00;
  Value *in_stack_ffffffffffffff80;
  _Self local_58 [3];
  _Self local_40;
  ValueHolder in_stack_ffffffffffffffc8;
  Value *in_stack_ffffffffffffffd0;
  bool local_1;
  
  if ((*(ushort *)(in_RDI + 8) & 0xff) == 7) {
    this_00 = (Value *)&stack0xffffffffffffffc8;
    CZString::CZString((CZString *)this_00,in_RSI,in_EDX - (int)in_RSI,noDuplication);
    __position = std::
                 map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
                 ::find((map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
                         *)in_stack_ffffffffffffff48,(key_type *)0x1fb01a);
    local_40._M_node = __position._M_node;
    local_58[0]._M_node =
         (_Base_ptr)
         std::
         map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
         ::end((map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
                *)in_stack_ffffffffffffff48);
    local_1 = std::operator==(&local_40,local_58);
    if (!local_1) {
      std::_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::operator->
                ((_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_> *)0x1fb084
                );
      Value(in_stack_ffffffffffffffd0,(Value *)in_stack_ffffffffffffffc8.map_);
      operator=(this_00,in_stack_ffffffffffffff48);
      ~Value(in_stack_ffffffffffffff80);
      std::
      map<Json::Value::CZString,Json::Value,std::less<Json::Value::CZString>,std::allocator<std::pair<Json::Value::CZString_const,Json::Value>>>
      ::erase_abi_cxx11_((map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
                          *)this_00,__position);
    }
    local_1 = !local_1;
    CZString::~CZString((CZString *)this_00);
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Value::removeMember(const char* key, const char* cend, Value* removed)
{
  if (type_ != objectValue) {
    return false;
  }
  CZString actualKey(key, static_cast<unsigned>(cend-key), CZString::noDuplication);
  ObjectValues::iterator it = value_.map_->find(actualKey);
  if (it == value_.map_->end())
    return false;
  *removed = it->second;
  value_.map_->erase(it);
  return true;
}